

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

bool ActionMarkImplied::checkImpliedCover(Funcdata *data,Varnode *vn)

{
  PcodeOp *pPVar1;
  PcodeOp *pPVar2;
  pointer ppVVar3;
  Varnode *a;
  bool bVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  pointer ppFVar7;
  pointer ppVVar8;
  HighVariable *high;
  long lVar9;
  
  pPVar1 = vn->def;
  if (pPVar1->opcode->opcode == CPUI_LOAD) {
    cVar5 = PcodeOpBank::end(&data->obank,CPUI_STORE);
    for (cVar6 = PcodeOpBank::begin(&data->obank,CPUI_STORE); cVar6._M_node != cVar5._M_node;
        cVar6._M_node = (cVar6._M_node)->_M_next) {
      pPVar2 = (PcodeOp *)cVar6._M_node[1]._M_next;
      if ((pPVar2->flags & 0x20) == 0) {
        Varnode::updateCover(vn);
        bVar4 = Cover::contain(vn->cover,pPVar2,2);
        if (bVar4) {
          ppVVar8 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppVVar3 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((((*ppVVar8)->loc).offset == ((*ppVVar3)->loc).offset) &&
             (bVar4 = isPossibleAlias(ppVVar8[1],ppVVar3[1],2), bVar4)) {
            return false;
          }
        }
      }
    }
  }
  if ((((pPVar1->flags & 4) != 0) || (pPVar1->opcode->opcode == CPUI_LOAD)) &&
     (ppFVar7 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(data->qlst).
                             super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7) >> 3))) {
    lVar9 = 0;
    do {
      pPVar2 = ppFVar7[lVar9]->op;
      Varnode::updateCover(vn);
      bVar4 = Cover::contain(vn->cover,pPVar2,2);
      if (bVar4) {
        return false;
      }
      lVar9 = lVar9 + 1;
      ppFVar7 = (data->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(data->qlst).
                                         super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7)
                          >> 3));
  }
  ppVVar8 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pPVar1->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppVVar8) >> 3)) {
    lVar9 = 0;
    do {
      a = ppVVar8[lVar9];
      if ((a->flags & 2) == 0) {
        high = Varnode::getHigh(vn);
        bVar4 = Merge::inflateTest(&data->covermerge,a,high);
        if (bVar4) {
          return false;
        }
      }
      lVar9 = lVar9 + 1;
      ppVVar8 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(pPVar1->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8)
                          >> 3));
  }
  return true;
}

Assistant:

bool ActionMarkImplied::checkImpliedCover(Funcdata &data,Varnode *vn)

{
  PcodeOp *op,*storeop,*callop;
  Varnode *defvn;
  int4 i;

  op = vn->getDef();
  if (op->code() == CPUI_LOAD) { // Check for loads crossing stores
    list<PcodeOp *>::const_iterator oiter,iterend;
    iterend = data.endOp(CPUI_STORE);
    for(oiter=data.beginOp(CPUI_STORE);oiter!=iterend;++oiter) {
      storeop = *oiter;
      if (storeop->isDead()) continue;
      if (vn->getCover()->contain(storeop,2)) {
				// The LOAD crosses a STORE. We are cavalier
				// and let it through unless we can verify
				// that the pointers are actually the same
	if (storeop->getIn(0)->getOffset() == op->getIn(0)->getOffset()) {
	  //	  if (!functionalDifference(storeop->getIn(1),op->getIn(1),2)) return false;
	  if (isPossibleAlias(storeop->getIn(1),op->getIn(1),2)) return false;
	}
      }
    }
  }
  if (op->isCall() || (op->code() == CPUI_LOAD)) { // loads crossing calls
    for(i=0;i<data.numCalls();++i) {
      callop = data.getCallSpecs(i)->getOp();
      if (vn->getCover()->contain(callop,2)) return false;
    }
  }
  for(i=0;i<op->numInput();++i) {
    defvn = op->getIn(i);
    if (defvn->isConstant()) continue;
    if (data.getMerge().inflateTest(defvn,vn->getHigh()))	// Test for intersection
      return false;
  }
  return true;
}